

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::TriggerConditionVisitor::visit(TriggerConditionVisitor *this,Var *var)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 local_38 [8];
  string base_name;
  Var *var_local;
  TriggerConditionVisitor *this_local;
  
  base_name.field_2._8_8_ = var;
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[0x29])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x138))();
  std::
  unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::emplace<std::__cxx11::string&>
            ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->values,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void visit(Var *var) override {
        auto base_name = var->get_var_root_parent()->base_name();
        values.emplace(base_name);
    }